

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  RegularExpression *this_00;
  string *path;
  cmCTest *this_01;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s;
  pointer pcVar6;
  pointer pcVar7;
  int iVar8;
  allocator<char> local_89;
  string local_88;
  int local_64;
  cmCTestBuildHandler *local_60;
  cmXMLWriter *local_58;
  string srcdir;
  
  iVar8 = this->MaxErrors;
  iVar3 = this->MaxWarnings;
  this_01 = (this->super_cmCTestGenericHandler).CTest;
  local_60 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"SourceDirectory",&local_89);
  cmCTest::GetCTestConfiguration(&srcdir,this_01,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cmsys::SystemTools::CollapseFullPath(&local_88,&srcdir);
  std::__cxx11::string::operator=((string *)&srcdir,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::append((char *)&srcdir);
  pcVar6 = (local_60->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = xml;
  do {
    if ((pcVar6 == (local_60->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish) || (iVar8 == 0 && iVar3 == 0)) {
      std::__cxx11::string::~string((string *)&srcdir);
      return;
    }
    bVar2 = pcVar6->Error;
    iVar4 = iVar3;
    if (bVar2 != false) {
      iVar4 = iVar8;
    }
    if (iVar4 != 0) {
      __s = "Warning";
      if (bVar2 != false) {
        __s = "Error";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
      cmXMLWriter::StartElement(xml,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"BuildLogLine",&local_89);
      local_64 = iVar3;
      cmXMLWriter::Element<int>(xml,&local_88,&pcVar6->LogLine);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Text",&local_89);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&pcVar6->Text);
      local_64 = local_64 - (uint)(bVar2 ^ 1);
      iVar8 = iVar8 - (uint)bVar2;
      std::__cxx11::string::~string((string *)&local_88);
      pcVar1 = (local_60->ErrorWarningFileLineRegex).
               super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pcVar7 = (local_60->ErrorWarningFileLineRegex).
                    super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                    ._M_impl.super__Vector_impl_data._M_start; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1
          ) {
        this_00 = &pcVar7->RegularExpression;
        bVar2 = cmsys::RegularExpression::find(this_00,&pcVar6->Text);
        if (bVar2) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_88,&this_00->regmatch,pcVar7->FileIndex);
          path = &pcVar6->SourceFile;
          std::__cxx11::string::operator=((string *)path,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          cmsys::SystemTools::ConvertToUnixSlashes(path);
          lVar5 = std::__cxx11::string::find((char *)path,0x4504a4);
          if (lVar5 == -1) {
            cmsys::SystemTools::CollapseFullPath(&local_88,path);
            std::__cxx11::string::operator=((string *)path,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            cmsys::SystemTools::ReplaceString(path,srcdir._M_dataplus._M_p,"");
          }
          else {
            cmsys::SystemTools::ReplaceString(path,"/.../","");
            lVar5 = std::__cxx11::string::find((char)path,0x2f);
            if (lVar5 != -1) {
              std::__cxx11::string::substr((ulong)&local_88,(ulong)path);
              std::__cxx11::string::operator=((string *)path,(string *)&local_88);
              std::__cxx11::string::~string((string *)&local_88);
            }
          }
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_88,&this_00->regmatch,pcVar7->LineIndex);
          iVar3 = atoi(local_88._M_dataplus._M_p);
          pcVar6->LineNumber = iVar3;
          std::__cxx11::string::~string((string *)&local_88);
          break;
        }
      }
      xml = local_58;
      iVar3 = local_64;
      if (((pcVar6->SourceFile)._M_string_length != 0) && (-1 < pcVar6->LineNumber)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"SourceFile",&local_89);
        cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&pcVar6->SourceFile);
        std::__cxx11::string::~string((string *)&local_88);
        if ((pcVar6->SourceFileTail)._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"SourceFileTail",&local_89);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&pcVar6->SourceFileTail);
          std::__cxx11::string::~string((string *)&local_88);
        }
        if (-1 < pcVar6->LineNumber) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"SourceLineNumber",&local_89);
          cmXMLWriter::Element<int>(xml,&local_88,&pcVar6->LineNumber);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"PreContext",&local_89)
      ;
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&pcVar6->PreContext);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"PostContext",&local_89);
      cmXMLWriter::StartElement(xml,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar6->PostContext);
      iVar4 = iVar3;
      if (pcVar6->Error != false) {
        iVar4 = iVar8;
      }
      if (iVar4 == 0) {
        cmXMLWriter::Content<char[72]>
                  (xml,(char (*) [72])
                       "\nThe maximum number of reported warnings or errors has been reached!!!\n");
      }
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"RepeatCount",&local_89);
      cmXMLWriter::Element<char[2]>(xml,&local_88,(char (*) [2])0x4ac3be);
      std::__cxx11::string::~string((string *)&local_88);
      cmXMLWriter::EndElement(xml);
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmSystemTools::CollapseFullPath(srcdir);
  srcdir += "/";
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}